

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
blockCheck(StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_> *this)

{
  undefined1 auVar1 [16];
  Translator **ppTVar2;
  ulong uVar3;
  Translator *pTVar4;
  int iVar5;
  StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_> *in_RDI;
  Translator **mem;
  Translator **in_stack_ffffffffffffffe0;
  
  if (0x1f < in_RDI->bsize) {
    if (in_RDI->dataSlotsAvailable == 0) {
      ppTVar2 = (Translator **)operator_new__(0x200);
      in_RDI->dataptr = ppTVar2;
      in_RDI->dataSlotsAvailable = 0x40;
      in_RDI->dataSlotIndex = -1;
    }
    else if (in_RDI->dataSlotsAvailable + -1 <= in_RDI->dataSlotIndex) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)in_RDI->dataSlotsAvailable << 1;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppTVar2 = (Translator **)operator_new__(uVar3);
      std::copy<helics::Translator**,helics::Translator**>
                (ppTVar2,(Translator **)in_RDI,in_stack_ffffffffffffffe0);
      if (in_RDI->dataptr != (Translator **)0x0) {
        operator_delete__(in_RDI->dataptr);
      }
      in_RDI->dataptr = ppTVar2;
      in_RDI->dataSlotsAvailable = in_RDI->dataSlotsAvailable << 1;
    }
    pTVar4 = getNewBlock(in_RDI);
    iVar5 = in_RDI->dataSlotIndex + 1;
    in_RDI->dataSlotIndex = iVar5;
    in_RDI->dataptr[iVar5] = pTVar4;
    in_RDI->bsize = 0;
  }
  return;
}

Assistant:

void blockCheck()
        {
            if (bsize >= static_cast<int>(blockSize)) {
                if (0 == dataSlotsAvailable) {
                    dataptr = new X*[64];
                    dataSlotsAvailable = 64;
                    dataSlotIndex = -1;
                } else if (dataSlotIndex >= dataSlotsAvailable - 1) {
                    auto mem =
                        new X*[static_cast<size_t>(dataSlotsAvailable) * 2];
                    std::copy(dataptr, dataptr + dataSlotsAvailable, mem);
                    delete[] dataptr;
                    dataptr = mem;
                    dataSlotsAvailable *= 2;
                }
                dataptr[++dataSlotIndex] = getNewBlock();
                bsize = 0;
            }
        }